

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_bbox.cpp
# Opt level: O3

BBox<2> * Omega_h::get_bounding_box<2>(BBox<2> *__return_storage_ptr__,Mesh *mesh)

{
  int *piVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  double dVar5;
  Comm *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  Alloc *local_38 [2];
  
  Mesh::coords((Mesh *)local_38);
  find_bounding_box<2>(__return_storage_ptr__,(Reals *)local_38);
  if (((ulong)local_38[0] & 7) == 0 && local_38[0] != (Alloc *)0x0) {
    piVar1 = &local_38[0]->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_38[0]);
      operator_delete(local_38[0],0x48);
    }
  }
  lVar4 = 0;
  bVar2 = true;
  do {
    bVar3 = bVar2;
    Mesh::comm(mesh);
    dVar5 = Comm::allreduce<double>
                      (local_48,(__return_storage_ptr__->min).super_Few<double,_2>.array_[lVar4],
                       OMEGA_H_MIN);
    (__return_storage_ptr__->min).super_Few<double,_2>.array_[lVar4] = dVar5;
    if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
    }
    Mesh::comm(mesh);
    dVar5 = Comm::allreduce<double>
                      (local_48,(__return_storage_ptr__->max).super_Few<double,_2>.array_[lVar4],
                       OMEGA_H_MAX);
    (__return_storage_ptr__->max).super_Few<double,_2>.array_[lVar4] = dVar5;
    if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
    }
    lVar4 = 1;
    bVar2 = false;
  } while (bVar3);
  return __return_storage_ptr__;
}

Assistant:

BBox<dim> get_bounding_box(Mesh* mesh) {
  auto bb = find_bounding_box<dim>(mesh->coords());
  for (Int i = 0; i < dim; ++i) {
    bb.min[i] = mesh->comm()->allreduce(bb.min[i], OMEGA_H_MIN);
    bb.max[i] = mesh->comm()->allreduce(bb.max[i], OMEGA_H_MAX);
  }
  return bb;
}